

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::internalInsert(QWidgetLineControl *this,QString *s)

{
  int iVar1;
  long lVar2;
  QObject *pQVar3;
  int iVar4;
  int i_1;
  int i;
  long lVar5;
  long in_FS_OFFSET;
  QAccessibleTextInsertEvent insertEvent;
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_98 [4];
  int iStack_94;
  char16_t *local_90;
  long local_88;
  undefined4 local_80;
  int local_7c;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(this + 0x50) & 0x30) == 0x20) {
    if (*(int *)(this + 0x124) != 0) {
      QBasicTimer::stop();
    }
    if (0 < (long)*(int *)(this + 0x128)) {
      QBasicTimer::start((QBasicTimer *)(this + 0x124),
                         (Duration)((long)*(int *)(this + 0x128) * 1000000),(QObject *)this);
    }
  }
  if (*(int *)(this + 0x110) < *(int *)(this + 0x114) && *(long *)(this + 0x28) != 0) {
    local_78[0] = 6;
    local_78._0_8_ = CONCAT44(*(undefined4 *)(this + 0x40),(int)local_78._0_8_) & 0xffffffff0000ffff
    ;
    local_78._8_8_ = *(undefined1 **)(this + 0x110);
    addCommand(this,(Command *)local_78);
  }
  if (*(long *)(this + 0xe8) == 0) {
    iVar4 = *(int *)(this + 0x60) - *(int *)(this + 0x28);
    if (iVar4 != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = *(QObject **)(this + 0x130);
      if (pQVar3 == (QObject *)0x0) {
        pQVar3 = *(QObject **)(*(long *)(this + 8) + 0x10);
      }
      QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
                ((QAccessibleTextInsertEvent *)local_78,pQVar3,*(int *)(this + 0x40),s);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_78);
      iVar1 = *(int *)(this + 0x40);
      QString::left((QString *)local_98,s,(long)iVar4);
      QString::insert((QString *)(this + 0x18),(long)iVar1,(QString *)local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
      lVar5 = 0;
      while( true ) {
        QString::left((QString *)local_98,s,(long)iVar4);
        lVar2 = (long)(int)local_88;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
        if (lVar2 <= lVar5) break;
        iVar1 = *(int *)(this + 0x40);
        *(int *)(this + 0x40) = iVar1 + 1;
        _local_98 = (code *)CONCAT71(stack0xffffffffffffff69,1);
        local_98 = (undefined1  [4])CONCAT22((s->d).ptr[lVar5],local_98._0_2_);
        _local_98 = (code *)CONCAT44(iVar1,local_98);
        local_90 = (char16_t *)0xffffffffffffffff;
        addCommand(this,(Command *)local_98);
        lVar5 = lVar5 + 1;
      }
      this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 0x40);
      QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent
                ((QAccessibleTextInsertEvent *)local_78);
    }
    if ((long)iVar4 < (s->d).size) {
      inputRejected(this);
    }
  }
  else {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    maskString((QString *)&local_b8,this,*(int *)(this + 0x40),s,false);
    if (((QString *)local_b8.size == (QString *)0x0) && ((s->d).size != 0)) {
      inputRejected(this);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = *(QObject **)(this + 0x130);
    if (pQVar3 == (QObject *)0x0) {
      pQVar3 = *(QObject **)(*(long *)(this + 8) + 0x10);
    }
    QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
              ((QAccessibleTextInsertEvent *)local_78,pQVar3,*(int *)(this + 0x40),
               (QString *)&local_b8);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_78);
    for (lVar5 = 0; lVar5 < (int)local_b8.size; lVar5 = lVar5 + 1) {
      _local_98 = (code *)CONCAT71(stack0xffffffffffffff69,5);
      local_98 = (undefined1  [4])
                 CONCAT22(*(char16_t *)
                           (*(long *)(this + 0x20) + (*(int *)(this + 0x40) + lVar5) * 2),
                          local_98._0_2_);
      _local_98 = (code *)CONCAT44((int)lVar5 + *(int *)(this + 0x40),local_98);
      local_90 = (char16_t *)0xffffffffffffffff;
      addCommand(this,(Command *)local_98);
      _local_98 = (code *)CONCAT71(stack0xffffffffffffff69,1);
      local_98 = (undefined1  [4])CONCAT22(local_b8.ptr[lVar5],local_98._0_2_);
      _local_98 = (code *)CONCAT44(*(int *)(this + 0x40) + (int)lVar5,local_98);
      local_90 = (char16_t *)0xffffffffffffffff;
      addCommand(this,(Command *)local_98);
    }
    QString::replace((longlong)(this + 0x18),(long)*(int *)(this + 0x40),(QString *)local_b8.size);
    iVar4 = *(int *)(this + 0x40);
    *(int *)(this + 0x40) = iVar4 + (int)local_b8.size;
    local_7c = nextMaskBlank(this,iVar4 + (int)local_b8.size);
    *(int *)(this + 0x40) = local_7c;
    this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 0x40);
    local_88 = *(long *)(this + 0x130);
    if (local_88 == 0) {
      local_88 = *(long *)(*(long *)(this + 8) + 0x10);
    }
    local_80 = 0xffffffff;
    _local_98 = QTextCursor::isNull;
    local_90 = (char16_t *)0xaaaaaaaa0000011b;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_98);
    QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)local_98);
    QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent((QAccessibleTextInsertEvent *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::internalInsert(const QString &s)
{
    if (m_echoMode == QLineEdit::Password) {
        if (m_passwordEchoTimer.isActive())
            m_passwordEchoTimer.stop();
        int delay = m_passwordMaskDelay;
#ifdef QT_BUILD_INTERNAL
        if (m_passwordMaskDelayOverride >= 0)
            delay = m_passwordMaskDelayOverride;
#endif

        if (delay > 0)
            m_passwordEchoTimer.start(delay * 1ms, this);
    }
    if (hasSelectedText())
        addCommand(Command(SetSelection, m_cursor, u'\0', m_selstart, m_selend));
    if (m_maskData) {
        QString ms = maskString(m_cursor, s);
        if (ms.isEmpty() && !s.isEmpty())
            emit inputRejected();
#if QT_CONFIG(accessibility)
        QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, ms);
        QAccessible::updateAccessibility(&insertEvent);
#endif
        for (int i = 0; i < (int) ms.size(); ++i) {
            addCommand (Command(DeleteSelection, m_cursor + i, m_text.at(m_cursor + i), -1, -1));
            addCommand(Command(Insert, m_cursor + i, ms.at(i), -1, -1));
        }
        m_text.replace(m_cursor, ms.size(), ms);
        m_cursor += ms.size();
        m_cursor = nextMaskBlank(m_cursor);
        m_textDirty = true;
#if QT_CONFIG(accessibility)
        QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
        QAccessible::updateAccessibility(&event);
#endif
    } else {
        int remaining = m_maxLength - m_text.size();
        if (remaining != 0) {
#if QT_CONFIG(accessibility)
            QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, s);
            QAccessible::updateAccessibility(&insertEvent);
#endif
            m_text.insert(m_cursor, s.left(remaining));
            for (int i = 0; i < (int) s.left(remaining).size(); ++i)
               addCommand(Command(Insert, m_cursor++, s.at(i), -1, -1));
            m_textDirty = true;
        }
        if (s.size() > remaining)
            emit inputRejected();
    }
}